

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> **t;
  HttpClient *pHVar1;
  SourceLocation location;
  SourceLocation location_00;
  Promise<kj::HttpClient::Response> *pPVar2;
  ConnectionCounter *counter_00;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *other;
  String *pSVar3;
  HttpHeaders *pHVar4;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *__x;
  TypeByIndex<0UL,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
  *t_00;
  Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *pPVar5;
  TypeByIndex<1UL,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
  *t_01;
  Promise<kj::HttpClient::Response> *pPVar6;
  uint __flags;
  StringPtr *params;
  void *__child_stack;
  void *__arg;
  undefined8 in_stack_fffffffffffffd50;
  Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> local_218 [2];
  SourceLocation local_208;
  undefined1 local_1f0 [8];
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  String local_1d0;
  HttpHeaders local_1b8;
  Maybe<unsigned_long> local_158;
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> local_148;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6509:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  HttpHeaders headersCopy;
  String urlCopy;
  SourceLocation local_c0;
  undefined1 local_a8 [8];
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  Promise<kj::HttpClient::Response> promise;
  Maybe<unsigned_long> local_78;
  ConcurrencyLimitingHttpClient *local_68;
  Header *pHStack_60;
  undefined1 local_58 [8];
  Request request;
  ConnectionCounter counter;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  ConcurrencyLimitingHttpClient *this_local;
  StringPtr url_local;
  
  url_local.content.ptr = (char *)url.content.size_;
  this_local = (ConcurrencyLimitingHttpClient *)url.content.ptr;
  url_local.content.size_ = (size_t)__return_storage_ptr__;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    ConnectionCounter::ConnectionCounter((ConnectionCounter *)&request.response,this);
    pHVar1 = this->inner;
    local_68 = this_local;
    pHStack_60 = (Header *)url_local.content.ptr;
    Maybe<unsigned_long>::Maybe(&local_78,expectedBodySize);
    (**pHVar1->_vptr_HttpClient)
              (local_58,pHVar1,(ulong)method,local_68,pHStack_60,headers,&local_78);
    Maybe<unsigned_long>::~Maybe(&local_78);
    fireCountChanged(this);
    pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>
                       ((Promise<kj::HttpClient::Response> *)&request.body.ptr);
    counter_00 = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                           ((ConnectionCounter *)&request.response);
    attachCounter((ConcurrencyLimitingHttpClient *)&paf.fulfiller.ptr,pPVar2,counter_00);
    other = mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                      ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_58);
    Own<kj::AsyncOutputStream,_std::nullptr_t>::Own(&__return_storage_ptr__->body,other);
    t = &paf.fulfiller.ptr;
    pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>((Promise<kj::HttpClient::Response> *)t);
    Promise<kj::HttpClient::Response>::Promise(&__return_storage_ptr__->response,pPVar2);
    Promise<kj::HttpClient::Response>::~Promise((Promise<kj::HttpClient::Response> *)t);
    HttpClient::Request::~Request((Request *)local_58);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&request.response);
  }
  else {
    __arg = (void *)0x10;
    SourceLocation::SourceLocation
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"request",0x1968);
    location_00.function = (char *)local_c0._16_8_;
    location_00.fileName = local_c0.function;
    location_00.lineNumber = (int)in_stack_fffffffffffffd50;
    location_00.columnNumber = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              (location_00);
    __flags = local_c0.lineNumber;
    str<kj::StringPtr&>((String *)&headersCopy.ownedStrings.builder.disposer,(kj *)&this_local,
                        params);
    HttpHeaders::clone((HttpHeaders *)&combined,(__fn *)headers,__child_stack,__flags,__arg);
    split.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr =
         (Promise<kj::HttpClient::Response>)(Promise<kj::HttpClient::Response>)this;
    pSVar3 = mv<kj::String>((String *)&headersCopy.ownedStrings.builder.disposer);
    String::String(&local_1d0,pSVar3);
    pHVar4 = mv<kj::HttpHeaders>((HttpHeaders *)&combined);
    HttpHeaders::HttpHeaders(&local_1b8,pHVar4);
    Maybe<unsigned_long>::Maybe(&local_158,expectedBodySize);
    Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
    then<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>
              (&local_148,(Type *)local_a8);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&split.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>
                      );
    SourceLocation::SourceLocation
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"request",0x1975,0x12);
    location.function = local_208.function;
    location.fileName = local_208.fileName;
    location.lineNumber = local_208.lineNumber;
    location.columnNumber = local_208.columnNumber;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)local_1f0,location);
    __x = mv<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
                    ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                      *)&paf);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this->pendingRequests,__x);
    fireCountChanged(this);
    t_00 = get<0ul,kj::_::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>,kj::Promise<kj::HttpClient::Response>>&>
                     ((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
                       *)local_1f0);
    pPVar5 = mv<kj::Promise<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>>(t_00);
    Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>::Promise(local_218,pPVar5);
    newPromisedStream((kj *)__return_storage_ptr__,local_218);
    pPVar2 = &__return_storage_ptr__->response;
    t_01 = get<1ul,kj::_::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>,kj::Promise<kj::HttpClient::Response>>&>
                     ((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
                       *)local_1f0);
    pPVar6 = mv<kj::Promise<kj::HttpClient::Response>>(t_01);
    Promise<kj::HttpClient::Response>::Promise(pPVar2,pPVar6);
    Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>::~Promise(local_218);
    kj::_::
    Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
    ::~Tuple((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
              *)local_1f0);
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::~Promise((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
                *)&local_148);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&combined);
    String::~String((String *)&headersCopy.ownedStrings.builder.disposer);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { newPromisedStream(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }